

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highwayhash_test_target.cc
# Opt level: O0

void __thiscall
highwayhash::HighwayHashCatTest<1U>::operator()
          (HighwayHashCatTest<1U> *this,HHKey *key,char *bytes,uint64_t size,HHResult64 *expected,
          HHNotify notify)

{
  HHNotify in_stack_00000188;
  unsigned_long *in_stack_00000190;
  size_t in_stack_00000198;
  char *in_stack_000001a0;
  HHKey *in_stack_000001a8;
  HHNotify notify_local;
  HHResult64 *expected_local;
  uint64_t size_local;
  char *bytes_local;
  HHKey *key_local;
  HighwayHashCatTest<1U> *this_local;
  
  anon_unknown_5::TestHighwayHashCat<unsigned_long>
            (in_stack_000001a8,in_stack_000001a0,in_stack_00000198,in_stack_00000190,
             in_stack_00000188);
  return;
}

Assistant:

void HighwayHashCatTest<Target>::operator()(const HHKey& key,
                                            const char* HH_RESTRICT bytes,
                                            const uint64_t size,
                                            const HHResult64* expected,
                                            const HHNotify notify) const {
  TestHighwayHashCat(key, bytes, size, expected, notify);
}